

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_url.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  curi_status cVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char buf [2048];
  size_t local_820;
  char local_818 [2048];
  
  pcVar2 = *argv;
  pcVar5 = strrchr(pcVar2,0x2f);
  pcVar6 = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    pcVar6 = pcVar2;
  }
  if (argc == 2) {
    pcVar2 = argv[1];
    iVar7 = 1;
    if (*pcVar2 != '-') {
      bVar3 = false;
      goto LAB_001012c2;
    }
    cVar1 = pcVar2[1];
    if ((cVar1 == '\0') || (pcVar2[2] != '\0')) goto LAB_001012a2;
    if (cVar1 == 'h') {
      iVar7 = 0;
      fprintf(_stdout,"usage: %s [-h] url\n",pcVar6);
    }
    else {
      fprintf(_stderr,"unknown option: \'%c\'\n",(ulong)(uint)(int)cVar1);
    }
  }
  else {
LAB_001012a2:
    fprintf(_stderr,"wrong # args: must be \"%s [-h] url\"\n",pcVar6);
    iVar7 = 1;
  }
  bVar3 = true;
LAB_001012c2:
  if (!bVar3) {
    cVar4 = curi_url_decode_nt(argv[(long)argc + -1],local_818,0x800,&local_820);
    if (cVar4 == curi_status_success) {
      local_818[local_820] = '\0';
      puts(local_818);
      iVar7 = 0;
    }
    else {
      main_cold_1();
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int main(int argc, char** argv)
{
    int rc;

    if ((rc = parse_args(argc, argv)) < 0)
        return rc == EXIT_OK ? EXIT_SUCCESS : EXIT_FAILURE;

    return decode(argv[argc - 1]);
}